

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

leb_Node leb_BoundingNode(leb_Heap *leb,float x,float y)

{
  float fVar1;
  bool bVar2;
  byte local_61;
  float t;
  float s;
  float local_20;
  float local_1c;
  float y_local;
  float x_local;
  leb_Heap *leb_local;
  leb_Node node;
  
  memset(&leb_local,0,8);
  if (((0.0 <= x) && (0.0 <= y)) && (x + y <= 1.0)) {
    leb_local = (leb_Heap *)0x1;
    local_20 = y;
    local_1c = x;
    while( true ) {
      fVar1 = local_20;
      bVar2 = leb_IsLeafNode(leb,(leb_Node)leb_local);
      local_61 = 0;
      if (!bVar2) {
        bVar2 = leb_IsCeilNode(leb,(leb_Node)leb_local);
        local_61 = bVar2 ^ 0xff;
      }
      if ((local_61 & 1) == 0) break;
      if (local_20 <= local_1c) {
        leb_local = (leb_Heap *)leb__RightChildNode((leb_Node)leb_local);
        local_20 = (1.0 - local_1c) - local_20;
      }
      else {
        leb_local = (leb_Heap *)leb__LeftChildNode((leb_Node)leb_local);
        local_20 = local_20 - local_1c;
        local_1c = 1.0 - local_1c;
      }
      local_1c = local_1c - fVar1;
    }
  }
  return (leb_Node)leb_local;
}

Assistant:

LEBDEF leb_Node leb_BoundingNode(const leb_Heap *leb, float x, float y)
{
    leb_Node node = {0u, 0};

    if (x >= 0.0f && y >= 0.0f && x + y <= 1.0f) {
        node = {1u, 0};

        while (!leb_IsLeafNode(leb, node) && !leb_IsCeilNode(leb, node)) {
            float s = x, t = y;

            if (s < t) {
                node = leb__LeftChildNode(node);
                x = (1.0f - s - t);
                y = (t - s);
            } else {
                node = leb__RightChildNode(node);
                x = (s - t);
                y = (1.0f - s - t);
            }
        }
    }

    return node;
}